

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O0

Ivy_Obj_t * Ivy_Maj(Ivy_Man_t *p,Ivy_Obj_t *pA,Ivy_Obj_t *pB,Ivy_Obj_t *pC)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pC_local;
  Ivy_Obj_t *pB_local;
  Ivy_Obj_t *pA_local;
  Ivy_Man_t *p_local;
  
  pIVar1 = Ivy_And(p,pA,pB);
  pIVar2 = Ivy_And(p,pA,pC);
  pIVar1 = Ivy_Or(p,pIVar1,pIVar2);
  pIVar2 = Ivy_And(p,pB,pC);
  pIVar1 = Ivy_Or(p,pIVar1,pIVar2);
  return pIVar1;
}

Assistant:

Ivy_Obj_t * Ivy_Maj( Ivy_Man_t * p, Ivy_Obj_t * pA, Ivy_Obj_t * pB, Ivy_Obj_t * pC )
{
    return Ivy_Or( p, Ivy_Or(p, Ivy_And(p, pA, pB), Ivy_And(p, pA, pC)), Ivy_And(p, pB, pC) );
}